

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbiscan.cpp
# Opt level: O1

RBBINode * __thiscall icu_63::RBBIRuleScanner::pushNewNode(RBBIRuleScanner *this,NodeType t)

{
  UErrorCode UVar1;
  RBBIRuleBuilder *pRVar2;
  UErrorCode *pUVar3;
  UParseError *pUVar4;
  RBBINode *this_00;
  uint uVar5;
  
  pRVar2 = this->fRB;
  pUVar3 = pRVar2->fStatus;
  UVar1 = *pUVar3;
  if (UVar1 < U_ILLEGAL_ARGUMENT_ERROR) {
    if (this->fNodeStackPtr < 99) {
      uVar5 = this->fNodeStackPtr + 1;
      this->fNodeStackPtr = uVar5;
      this_00 = (RBBINode *)UMemory::operator_new((UMemory *)0xa0,(ulong)uVar5);
      if (this_00 == (RBBINode *)0x0) {
        this_00 = (RBBINode *)0x0;
      }
      else {
        RBBINode::RBBINode(this_00,t);
      }
      this->fNodeStack[this->fNodeStackPtr] = this_00;
      if (this_00 != (RBBINode *)0x0) {
        return this_00;
      }
      *this->fRB->fStatus = U_MEMORY_ALLOCATION_ERROR;
      return (RBBINode *)0x0;
    }
    if (UVar1 < U_ILLEGAL_ARGUMENT_ERROR) {
      *pUVar3 = U_BRK_RULE_SYNTAX;
      pUVar4 = pRVar2->fParseError;
      if (pUVar4 != (UParseError *)0x0) {
        pUVar4->line = this->fLineNum;
        pUVar4->offset = this->fCharNum;
        pUVar4->preContext[0] = L'\0';
        pUVar4->postContext[0] = L'\0';
        return (RBBINode *)0x0;
      }
    }
  }
  return (RBBINode *)0x0;
}

Assistant:

RBBINode  *RBBIRuleScanner::pushNewNode(RBBINode::NodeType  t) {
    if (U_FAILURE(*fRB->fStatus)) {
        return NULL;
    }
    if (fNodeStackPtr >= kStackSize - 1) {
        error(U_BRK_RULE_SYNTAX);
        RBBIDebugPuts("RBBIRuleScanner::pushNewNode - stack overflow.");
        return NULL;
    }
    fNodeStackPtr++;
    fNodeStack[fNodeStackPtr] = new RBBINode(t);
    if (fNodeStack[fNodeStackPtr] == NULL) {
        *fRB->fStatus = U_MEMORY_ALLOCATION_ERROR;
    }
    return fNodeStack[fNodeStackPtr];
}